

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_blocking_q.h
# Opt level: O0

void __thiscall
spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::enqueue_if_have_room
          (mpmc_blocking_queue<spdlog::details::async_msg> *this,async_msg *item)

{
  bool bVar1;
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> lock;
  bool pushed;
  mutex_type *in_stack_ffffffffffffffc8;
  async_msg *in_stack_ffffffffffffffd8;
  circular_q<spdlog::details::async_msg> *in_stack_ffffffffffffffe0;
  
  std::unique_lock<std::mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffc8);
  bVar1 = circular_q<spdlog::details::async_msg>::full
                    ((circular_q<spdlog::details::async_msg> *)&in_RDI[8]._M_owns);
  if (!bVar1) {
    circular_q<spdlog::details::async_msg>::push_back
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  if (!bVar1) {
    std::condition_variable::notify_one();
  }
  else {
    CLI::std::__atomic_base<unsigned_long>::operator++
              ((__atomic_base<unsigned_long> *)(in_RDI + 0xc));
  }
  return;
}

Assistant:

void enqueue_if_have_room(T &&item) {
        bool pushed = false;
        {
            std::unique_lock<std::mutex> lock(queue_mutex_);
            if (!q_.full()) {
                q_.push_back(std::move(item));
                pushed = true;
            }
        }

        if (pushed) {
            push_cv_.notify_one();
        } else {
            ++discard_counter_;
        }
    }